

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

ssize_t __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::write
          (xml_buffered_writer *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  
  uVar1 = this->bufsize;
  if (0x7fa < uVar1) {
    flush(this);
    uVar1 = 0;
  }
  this->buffer[uVar1] = '&';
  this->buffer[uVar1 + 1] = (char_t)__fd;
  this->buffer[uVar1 + 2] = (char_t)__buf;
  this->buffer[uVar1 + 3] = 'o';
  this->buffer[uVar1 + 4] = (char_t)__n;
  this->buffer[uVar1 + 5] = ';';
  this->bufsize = uVar1 + 6;
  return uVar1 + 6;
}

Assistant:

void write(char_t d0, char_t d1, char_t d2, char_t d3, char_t d4, char_t d5)
		{
			size_t offset = bufsize;
			if (offset > bufcapacity - 6) offset = flush();

			buffer[offset + 0] = d0;
			buffer[offset + 1] = d1;
			buffer[offset + 2] = d2;
			buffer[offset + 3] = d3;
			buffer[offset + 4] = d4;
			buffer[offset + 5] = d5;
			bufsize = offset + 6;
		}